

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

void __thiscall QCommandLineOption::setFlags(QCommandLineOption *this,Flags flags)

{
  long lVar1;
  QCommandLineOptionPrivate *pQVar2;
  Int in_ESI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QCommandLineOptionPrivate>::operator->
                     ((QSharedDataPointer<QCommandLineOptionPrivate> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  (pQVar2->flags).super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
  super_QFlagsStorage<QCommandLineOption::Flag>.i = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCommandLineOption::setFlags(Flags flags)
{
    d->flags = flags;
}